

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meld.cpp
# Opt level: O0

bool __thiscall mahjong::Meld::isSame(Meld *this,Meld *meld)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  bool local_1b;
  IsSame local_1a;
  IsSame local_19;
  Meld *local_18;
  Meld *meld_local;
  Meld *this_local;
  
  local_18 = meld;
  meld_local = this;
  pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
  pvVar3 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&local_18->tiles);
  bVar1 = IsSame::operator()(&local_19,pvVar2,pvVar3);
  local_1b = false;
  if (bVar1) {
    pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::back(&this->tiles);
    pvVar3 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::back(&local_18->tiles);
    local_1b = IsSame::operator()(&local_1a,pvVar2,pvVar3);
  }
  return local_1b;
}

Assistant:

bool Meld::isSame(const Meld& meld) const
{
	return IsSame()(tiles.front(), meld.tiles.front()) &&
		IsSame()(tiles.back(), meld.tiles.back());
}